

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interpreter.cpp
# Opt level: O0

Iter __thiscall mocker::ir::Interpreter::readStringLiteral(Interpreter *this,Iter iter,Iter end)

{
  bool bVar1;
  reference pcVar2;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  _Var3;
  Interpreter *this_local;
  Iter end_local;
  Iter iter_local;
  
  this_local = (Interpreter *)end._M_current;
  end_local = iter;
  bVar1 = __gnu_cxx::operator<
                    (&end_local,
                     (__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)&this_local);
  if (!bVar1) {
    __assert_fail("iter < end",
                  "/workspace/llm4binary/github/license_c_cmakelists/Engineev[P]mocker/ir-interpreter/interpreter.cpp"
                  ,0x45,
                  "Interpreter::Iter mocker::ir::Interpreter::readStringLiteral(Interpreter::Iter, Interpreter::Iter) const"
                 );
  }
  pcVar2 = __gnu_cxx::
           __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           ::operator*(&end_local);
  if (*pcVar2 != '\"') {
    __assert_fail("*iter == \'\\\"\'",
                  "/workspace/llm4binary/github/license_c_cmakelists/Engineev[P]mocker/ir-interpreter/interpreter.cpp"
                  ,0x46,
                  "Interpreter::Iter mocker::ir::Interpreter::readStringLiteral(Interpreter::Iter, Interpreter::Iter) const"
                 );
  }
  __gnu_cxx::
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::operator++(&end_local);
  do {
    while( true ) {
      pcVar2 = __gnu_cxx::
               __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               ::operator*(&end_local);
      if (*pcVar2 == '\"') {
        _Var3 = __gnu_cxx::
                __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                ::operator+(&end_local,1);
        return (Iter)_Var3._M_current;
      }
      pcVar2 = __gnu_cxx::
               __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               ::operator*(&end_local);
      if (*pcVar2 != '\\') break;
      __gnu_cxx::
      __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator+=(&end_local,2);
      bVar1 = __gnu_cxx::operator<
                        (&end_local,
                         (__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                          *)&this_local);
      if (!bVar1) {
        __assert_fail("iter < end",
                      "/workspace/llm4binary/github/license_c_cmakelists/Engineev[P]mocker/ir-interpreter/interpreter.cpp"
                      ,0x4b,
                      "Interpreter::Iter mocker::ir::Interpreter::readStringLiteral(Interpreter::Iter, Interpreter::Iter) const"
                     );
      }
    }
    __gnu_cxx::
    __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator++(&end_local);
    bVar1 = __gnu_cxx::operator!=
                      (&end_local,
                       (__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        *)&this_local);
  } while (bVar1);
  __assert_fail("iter != end",
                "/workspace/llm4binary/github/license_c_cmakelists/Engineev[P]mocker/ir-interpreter/interpreter.cpp"
                ,0x4f,
                "Interpreter::Iter mocker::ir::Interpreter::readStringLiteral(Interpreter::Iter, Interpreter::Iter) const"
               );
}

Assistant:

Interpreter::Iter Interpreter::readStringLiteral(Interpreter::Iter iter,
                                                 Interpreter::Iter end) const {
  assert(iter < end);
  assert(*iter == '\"');
  ++iter;
  while (*iter != '\"') {
    if (*iter == '\\') {
      iter += 2;
      assert(iter < end);
      continue;
    }
    ++iter;
    assert(iter != end);
  }
  return iter + 1;
}